

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_texshader.cpp
# Opt level: O1

void __thiscall FShaderLayer::FShaderLayer(FShaderLayer *this,FShaderLayer *layer)

{
  FShaderLayer *layer_00;
  float fVar1;
  bool bVar2;
  bool bVar3;
  undefined2 uVar4;
  CycleType CVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  FShaderLayer *this_00;
  
  FCycler::FCycler(&this->adjustX);
  FCycler::FCycler(&this->adjustY);
  FCycler::FCycler(&this->vectorX);
  FCycler::FCycler(&this->vectorY);
  FCycler::FCycler(&this->scaleX);
  FCycler::FCycler(&this->scaleY);
  FCycler::FCycler(&this->alpha);
  FCycler::FCycler(&this->r);
  FCycler::FCycler(&this->g);
  FCycler::FCycler(&this->b);
  FCycler::FCycler(&this->srcFactor);
  FCycler::FCycler(&this->dstFactor);
  (this->texture).texnum = (layer->texture).texnum;
  this->animate = layer->animate;
  this->emissive = layer->emissive;
  fVar6 = (layer->adjustX).m_start;
  fVar7 = (layer->adjustX).m_end;
  fVar8 = (layer->adjustX).m_current;
  fVar9 = (layer->adjustX).m_time;
  fVar1 = (layer->adjustX).m_cycle;
  bVar2 = (layer->adjustX).m_increment;
  bVar3 = (layer->adjustX).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->adjustX).field_0x16;
  CVar5 = (layer->adjustX).m_cycleType;
  (this->adjustX).m_time = (layer->adjustX).m_time;
  (this->adjustX).m_cycle = fVar1;
  (this->adjustX).m_increment = bVar2;
  (this->adjustX).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->adjustX).field_0x16 = uVar4;
  (this->adjustX).m_cycleType = CVar5;
  (this->adjustX).m_start = fVar6;
  (this->adjustX).m_end = fVar7;
  (this->adjustX).m_current = fVar8;
  (this->adjustX).m_time = fVar9;
  fVar1 = (layer->adjustY).m_end;
  fVar6 = (layer->adjustY).m_current;
  fVar7 = (layer->adjustY).m_time;
  fVar8 = (layer->adjustY).m_time;
  fVar9 = (layer->adjustY).m_cycle;
  bVar2 = (layer->adjustY).m_increment;
  bVar3 = (layer->adjustY).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->adjustY).field_0x16;
  CVar5 = (layer->adjustY).m_cycleType;
  (this->adjustY).m_start = (layer->adjustY).m_start;
  (this->adjustY).m_end = fVar1;
  (this->adjustY).m_current = fVar6;
  (this->adjustY).m_time = fVar7;
  (this->adjustY).m_time = fVar8;
  (this->adjustY).m_cycle = fVar9;
  (this->adjustY).m_increment = bVar2;
  (this->adjustY).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->adjustY).field_0x16 = uVar4;
  (this->adjustY).m_cycleType = CVar5;
  this->blendFuncSrc = layer->blendFuncSrc;
  this->blendFuncDst = layer->blendFuncDst;
  this->offsetX = layer->offsetX;
  this->offsetY = layer->offsetY;
  this->centerX = layer->centerX;
  this->centerY = layer->centerX;
  this->rotate = layer->rotate;
  this->rotation = layer->rotation;
  fVar6 = (layer->scaleX).m_start;
  fVar7 = (layer->scaleX).m_end;
  fVar8 = (layer->scaleX).m_current;
  fVar9 = (layer->scaleX).m_time;
  fVar1 = (layer->scaleX).m_cycle;
  bVar2 = (layer->scaleX).m_increment;
  bVar3 = (layer->scaleX).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->scaleX).field_0x16;
  CVar5 = (layer->scaleX).m_cycleType;
  (this->scaleX).m_time = (layer->scaleX).m_time;
  (this->scaleX).m_cycle = fVar1;
  (this->scaleX).m_increment = bVar2;
  (this->scaleX).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->scaleX).field_0x16 = uVar4;
  (this->scaleX).m_cycleType = CVar5;
  (this->scaleX).m_start = fVar6;
  (this->scaleX).m_end = fVar7;
  (this->scaleX).m_current = fVar8;
  (this->scaleX).m_time = fVar9;
  fVar6 = (layer->scaleY).m_start;
  fVar7 = (layer->scaleY).m_end;
  fVar8 = (layer->scaleY).m_current;
  fVar9 = (layer->scaleY).m_time;
  fVar1 = (layer->scaleY).m_cycle;
  bVar2 = (layer->scaleY).m_increment;
  bVar3 = (layer->scaleY).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->scaleY).field_0x16;
  CVar5 = (layer->scaleY).m_cycleType;
  (this->scaleY).m_time = (layer->scaleY).m_time;
  (this->scaleY).m_cycle = fVar1;
  (this->scaleY).m_increment = bVar2;
  (this->scaleY).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->scaleY).field_0x16 = uVar4;
  (this->scaleY).m_cycleType = CVar5;
  (this->scaleY).m_start = fVar6;
  (this->scaleY).m_end = fVar7;
  (this->scaleY).m_current = fVar8;
  (this->scaleY).m_time = fVar9;
  fVar6 = (layer->vectorX).m_start;
  fVar7 = (layer->vectorX).m_end;
  fVar8 = (layer->vectorX).m_current;
  fVar9 = (layer->vectorX).m_time;
  fVar1 = (layer->vectorX).m_cycle;
  bVar2 = (layer->vectorX).m_increment;
  bVar3 = (layer->vectorX).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->vectorX).field_0x16;
  CVar5 = (layer->vectorX).m_cycleType;
  (this->vectorX).m_time = (layer->vectorX).m_time;
  (this->vectorX).m_cycle = fVar1;
  (this->vectorX).m_increment = bVar2;
  (this->vectorX).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->vectorX).field_0x16 = uVar4;
  (this->vectorX).m_cycleType = CVar5;
  (this->vectorX).m_start = fVar6;
  (this->vectorX).m_end = fVar7;
  (this->vectorX).m_current = fVar8;
  (this->vectorX).m_time = fVar9;
  fVar6 = (layer->vectorY).m_start;
  fVar7 = (layer->vectorY).m_end;
  fVar8 = (layer->vectorY).m_current;
  fVar9 = (layer->vectorY).m_time;
  fVar1 = (layer->vectorY).m_cycle;
  bVar2 = (layer->vectorY).m_increment;
  bVar3 = (layer->vectorY).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->vectorY).field_0x16;
  CVar5 = (layer->vectorY).m_cycleType;
  (this->vectorY).m_time = (layer->vectorY).m_time;
  (this->vectorY).m_cycle = fVar1;
  (this->vectorY).m_increment = bVar2;
  (this->vectorY).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->vectorY).field_0x16 = uVar4;
  (this->vectorY).m_cycleType = CVar5;
  (this->vectorY).m_start = fVar6;
  (this->vectorY).m_end = fVar7;
  (this->vectorY).m_current = fVar8;
  (this->vectorY).m_time = fVar9;
  fVar6 = (layer->alpha).m_start;
  fVar7 = (layer->alpha).m_end;
  fVar8 = (layer->alpha).m_current;
  fVar9 = (layer->alpha).m_time;
  fVar1 = (layer->alpha).m_cycle;
  bVar2 = (layer->alpha).m_increment;
  bVar3 = (layer->alpha).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->alpha).field_0x16;
  CVar5 = (layer->alpha).m_cycleType;
  (this->alpha).m_time = (layer->alpha).m_time;
  (this->alpha).m_cycle = fVar1;
  (this->alpha).m_increment = bVar2;
  (this->alpha).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->alpha).field_0x16 = uVar4;
  (this->alpha).m_cycleType = CVar5;
  (this->alpha).m_start = fVar6;
  (this->alpha).m_end = fVar7;
  (this->alpha).m_current = fVar8;
  (this->alpha).m_time = fVar9;
  fVar1 = (layer->r).m_end;
  fVar6 = (layer->r).m_current;
  fVar7 = (layer->r).m_time;
  fVar8 = (layer->r).m_time;
  fVar9 = (layer->r).m_cycle;
  bVar2 = (layer->r).m_increment;
  bVar3 = (layer->r).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->r).field_0x16;
  CVar5 = (layer->r).m_cycleType;
  (this->r).m_start = (layer->r).m_start;
  (this->r).m_end = fVar1;
  (this->r).m_current = fVar6;
  (this->r).m_time = fVar7;
  (this->r).m_time = fVar8;
  (this->r).m_cycle = fVar9;
  (this->r).m_increment = bVar2;
  (this->r).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->r).field_0x16 = uVar4;
  (this->r).m_cycleType = CVar5;
  fVar1 = (layer->g).m_end;
  fVar6 = (layer->g).m_current;
  fVar7 = (layer->g).m_time;
  fVar8 = (layer->g).m_time;
  fVar9 = (layer->g).m_cycle;
  bVar2 = (layer->g).m_increment;
  bVar3 = (layer->g).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->g).field_0x16;
  CVar5 = (layer->g).m_cycleType;
  (this->g).m_start = (layer->g).m_start;
  (this->g).m_end = fVar1;
  (this->g).m_current = fVar6;
  (this->g).m_time = fVar7;
  (this->g).m_time = fVar8;
  (this->g).m_cycle = fVar9;
  (this->g).m_increment = bVar2;
  (this->g).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->g).field_0x16 = uVar4;
  (this->g).m_cycleType = CVar5;
  fVar1 = (layer->b).m_end;
  fVar6 = (layer->b).m_current;
  fVar7 = (layer->b).m_time;
  fVar8 = (layer->b).m_time;
  fVar9 = (layer->b).m_cycle;
  bVar2 = (layer->b).m_increment;
  bVar3 = (layer->b).m_shouldCycle;
  uVar4 = *(undefined2 *)&(layer->b).field_0x16;
  CVar5 = (layer->b).m_cycleType;
  (this->b).m_start = (layer->b).m_start;
  (this->b).m_end = fVar1;
  (this->b).m_current = fVar6;
  (this->b).m_time = fVar7;
  (this->b).m_time = fVar8;
  (this->b).m_cycle = fVar9;
  (this->b).m_increment = bVar2;
  (this->b).m_shouldCycle = bVar3;
  *(undefined2 *)&(this->b).field_0x16 = uVar4;
  (this->b).m_cycleType = CVar5;
  this->flags = layer->flags;
  layer_00 = layer->layerMask;
  if (layer_00 == (FShaderLayer *)0x0) {
    this_00 = (FShaderLayer *)0x0;
  }
  else {
    this_00 = (FShaderLayer *)operator_new(0x188);
    FShaderLayer(this_00,layer_00);
  }
  this->layerMask = this_00;
  this->texgen = layer->texgen;
  this->warp = layer->warp;
  this->warpspeed = layer->warpspeed;
  return;
}

Assistant:

FShaderLayer::FShaderLayer(const FShaderLayer &layer)
{
	texture = layer.texture;
	animate = layer.animate;
	emissive = layer.emissive;
	adjustX = layer.adjustX;
	adjustY = layer.adjustY;
	blendFuncSrc = layer.blendFuncSrc;
	blendFuncDst = layer.blendFuncDst;
	offsetX = layer.offsetX;
	offsetY = layer.offsetY;
	centerX = layer.centerX;
	centerY = layer.centerX;
	rotate = layer.rotate;
	rotation = layer.rotation;
	scaleX = layer.scaleX;
	scaleY = layer.scaleY;
	vectorX = layer.vectorX;
	vectorY = layer.vectorY;
	alpha = layer.alpha;
	r = layer.r;
	g = layer.g;
	b = layer.b;
	flags = layer.flags;
	if (layer.layerMask)
	{
		layerMask = new FShaderLayer(*(layer.layerMask));
	}
	else
	{
		layerMask = NULL;
	}
	texgen = layer.texgen;
	warp = layer.warp;
	warpspeed = layer.warpspeed;
}